

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

int compare_int64(void *a,void *b)

{
  int64_t b64;
  int64_t a64;
  void *b_local;
  void *a_local;
  undefined4 local_4;
  
  if (*a < *b) {
    local_4 = -1;
  }
  else if (*a == *b) {
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int compare_int64(const void *a, const void *b) {
  int64_t a64 = *((int64_t *)a);
  int64_t b64 = *((int64_t *)b);
  if (a64 < b64) {
    return -1;
  } else if (a64 == b64) {
    return 0;
  } else {
    return 1;
  }
}